

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# containers.cpp
# Opt level: O1

void __thiscall field3d<cellj>::field3d(field3d<cellj> *this,int nx0,int ny0,int nz0)

{
  int iVar1;
  uint uVar2;
  int iVar3;
  cellj **ppcVar4;
  cellj *pcVar5;
  undefined1 auVar6 [16];
  cellj ***__s;
  cellj **__s_00;
  cellj *__s_01;
  long lVar7;
  long lVar8;
  long lVar9;
  int iVar10;
  int iVar11;
  ulong uVar12;
  pointer *__ptr;
  
  this->nx = nx0;
  this->ny = ny0;
  this->nz = nz0;
  uVar12 = (long)nx0 * 8;
  if (nx0 < 0) {
    uVar12 = 0xffffffffffffffff;
  }
  (this->p)._M_t.super___uniq_ptr_impl<cellj_**,_std::default_delete<cellj_**[]>_>._M_t.
  super__Tuple_impl<0UL,_cellj_***,_std::default_delete<cellj_**[]>_>.
  super__Head_base<0UL,_cellj_***,_false>._M_head_impl = (cellj ***)0x0;
  (this->p2)._M_t.super___uniq_ptr_impl<cellj_*,_std::default_delete<cellj_*[]>_>._M_t.
  super__Tuple_impl<0UL,_cellj_**,_std::default_delete<cellj_*[]>_>.
  super__Head_base<0UL,_cellj_**,_false>._M_head_impl = (cellj **)0x0;
  (this->p3)._M_t.super___uniq_ptr_impl<cellj,_std::default_delete<cellj[]>_>._M_t.
  super__Tuple_impl<0UL,_cellj_*,_std::default_delete<cellj[]>_>.
  super__Head_base<0UL,_cellj_*,_false>._M_head_impl = (cellj *)0x0;
  __s = (cellj ***)operator_new__(uVar12);
  memset(__s,0,uVar12);
  (this->p)._M_t.super___uniq_ptr_impl<cellj_**,_std::default_delete<cellj_**[]>_>._M_t.
  super__Tuple_impl<0UL,_cellj_***,_std::default_delete<cellj_**[]>_>.
  super__Head_base<0UL,_cellj_***,_false>._M_head_impl = __s;
  lVar7 = (long)this->ny * (long)this->nx;
  uVar12 = lVar7 * 8;
  if ((int)lVar7 < 0) {
    uVar12 = 0xffffffffffffffff;
  }
  __s_00 = (cellj **)operator_new__(uVar12);
  memset(__s_00,0,uVar12);
  ppcVar4 = (this->p2)._M_t.super___uniq_ptr_impl<cellj_*,_std::default_delete<cellj_*[]>_>._M_t.
            super__Tuple_impl<0UL,_cellj_**,_std::default_delete<cellj_*[]>_>.
            super__Head_base<0UL,_cellj_**,_false>._M_head_impl;
  (this->p2)._M_t.super___uniq_ptr_impl<cellj_*,_std::default_delete<cellj_*[]>_>._M_t.
  super__Tuple_impl<0UL,_cellj_**,_std::default_delete<cellj_*[]>_>.
  super__Head_base<0UL,_cellj_**,_false>._M_head_impl = __s_00;
  if (ppcVar4 != (cellj **)0x0) {
    operator_delete__(ppcVar4);
  }
  lVar7 = (long)this->nx;
  if (0 < lVar7) {
    iVar1 = this->ny;
    lVar8 = 0;
    lVar9 = 0;
    do {
      (this->p)._M_t.super___uniq_ptr_impl<cellj_**,_std::default_delete<cellj_**[]>_>._M_t.
      super__Tuple_impl<0UL,_cellj_***,_std::default_delete<cellj_**[]>_>.
      super__Head_base<0UL,_cellj_***,_false>._M_head_impl[lVar9] =
           (cellj **)
           ((long)(this->p2)._M_t.super___uniq_ptr_impl<cellj_*,_std::default_delete<cellj_*[]>_>.
                  _M_t.super__Tuple_impl<0UL,_cellj_**,_std::default_delete<cellj_*[]>_>.
                  super__Head_base<0UL,_cellj_**,_false>._M_head_impl + lVar8);
      lVar9 = lVar9 + 1;
      lVar8 = lVar8 + (long)iVar1 * 8;
    } while (lVar7 != lVar9);
  }
  auVar6._8_8_ = 0;
  auVar6._0_8_ = (long)this->nz * this->ny * lVar7;
  uVar12 = 0xffffffffffffffff;
  if (SUB168(auVar6 * ZEXT816(0x18),8) == 0) {
    uVar12 = SUB168(auVar6 * ZEXT816(0x18),0);
  }
  __s_01 = (cellj *)operator_new__(uVar12);
  memset(__s_01,0,uVar12);
  pcVar5 = (this->p3)._M_t.super___uniq_ptr_impl<cellj,_std::default_delete<cellj[]>_>._M_t.
           super__Tuple_impl<0UL,_cellj_*,_std::default_delete<cellj[]>_>.
           super__Head_base<0UL,_cellj_*,_false>._M_head_impl;
  (this->p3)._M_t.super___uniq_ptr_impl<cellj,_std::default_delete<cellj[]>_>._M_t.
  super__Tuple_impl<0UL,_cellj_*,_std::default_delete<cellj[]>_>.
  super__Head_base<0UL,_cellj_*,_false>._M_head_impl = __s_01;
  if (pcVar5 != (cellj *)0x0) {
    operator_delete__(pcVar5);
  }
  iVar1 = this->nx;
  if (0 < (long)iVar1) {
    uVar2 = this->ny;
    iVar3 = this->nz;
    iVar10 = 0;
    lVar7 = 0;
    do {
      if (0 < (int)uVar2) {
        uVar12 = 0;
        iVar11 = iVar10;
        do {
          (this->p)._M_t.super___uniq_ptr_impl<cellj_**,_std::default_delete<cellj_**[]>_>._M_t.
          super__Tuple_impl<0UL,_cellj_***,_std::default_delete<cellj_**[]>_>.
          super__Head_base<0UL,_cellj_***,_false>._M_head_impl[lVar7][uVar12] =
               (this->p3)._M_t.super___uniq_ptr_impl<cellj,_std::default_delete<cellj[]>_>._M_t.
               super__Tuple_impl<0UL,_cellj_*,_std::default_delete<cellj[]>_>.
               super__Head_base<0UL,_cellj_*,_false>._M_head_impl + iVar11;
          uVar12 = uVar12 + 1;
          iVar11 = iVar11 + iVar3;
        } while (uVar2 != uVar12);
      }
      lVar7 = lVar7 + 1;
      iVar10 = iVar10 + uVar2 * iVar3;
    } while (lVar7 != iVar1);
  }
  return;
}

Assistant:

field3d<T>::field3d(int nx0, int ny0, int nz0) : nx(nx0), ny(ny0), nz(nz0) {

    p = std::unique_ptr<T**[]>(new T**[nx]());

    p2 = std::unique_ptr<T*[]>(new T*[nx * ny]());
    for(int i=0; i<nx; i++)
    {
        p[i] = &(p2[ny*i]);
    }

    p3 = std::unique_ptr<T[]>(new T[nx * ny * nz]());
    for(int i=0; i<nx; i++)
    {
        for(int j=0; j<ny; j++)
        {
            p[i][j] = &(p3[nz*ny*i + nz*j]);
        }
    }
}